

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O0

string * __thiscall test_app::str_abi_cxx11_(test_app *this)

{
  void *this_00;
  long in_RSI;
  string *in_RDI;
  size_t pos;
  string *result;
  string local_40 [39];
  undefined1 local_19;
  long local_18;
  
  cppcms::application::response();
  this_00 = (void *)cppcms::http::response::out();
  std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
  local_18 = std::__cxx11::string::find((char *)(in_RSI + 0x28),0x12e457);
  local_19 = 0;
  std::__cxx11::string::string(in_RDI);
  if (local_18 == -1) {
    std::__cxx11::string::operator=(in_RDI,(string *)(in_RSI + 0x28));
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,in_RSI + 0x28);
    std::__cxx11::string::operator=(in_RDI,local_40);
    std::__cxx11::string::~string(local_40);
  }
  std::__cxx11::string::clear();
  return in_RDI;
}

Assistant:

std::string str()
	{
		response().out() << std::flush;
		size_t pos = output_.find("\r\n\r\n");
		std::string result;
		if(pos != std::string::npos) {
			result = output_.substr(pos+4);
		}
		else {
			result = output_;
		}
		output_.clear();
		return result;
	}